

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# leave.hpp
# Opt level: O0

void __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::rejectLeave(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *this,int leaveNum,SPxId leaveId,Status leaveStat,
             SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *param_5)

{
  bool bVar1;
  Status *pSVar2;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar3;
  Status in_ECX;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_RDI;
  Desc *ds;
  undefined4 in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff5c;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  Status local_58;
  int local_54 [3];
  SPxId local_48;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_40;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_38;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_30;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_28;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_20;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_18;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_10;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_8;
  
  local_58 = in_ECX;
  SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::desc(&in_RDI->
          super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        );
  bVar1 = SPxId::isSPxRowId(&local_48);
  if (bVar1) {
    pSVar2 = SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ::Desc::rowStatus((Desc *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60)
                               ,in_stack_ffffffffffffff5c);
    SPxOut::
    debug<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_const_char_(&)[44],_int_&,_soplex::SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Desc::Status_&,_soplex::SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Desc::Status_&,_0>
              (in_RDI,(char (*) [44])"DLEAVE58 rejectLeave()  : row {}: {} -> {}\n",local_54,pSVar2,
               &local_58);
    if (local_58 == D_ON_BOTH) {
      pSVar2 = SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ::Desc::rowStatus((Desc *)CONCAT44(in_stack_ffffffffffffff64,
                                                  in_stack_ffffffffffffff60),
                                 in_stack_ffffffffffffff5c);
      if (*pSVar2 == P_ON_LOWER) {
        pnVar3 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                              in_stack_ffffffffffffff5c);
        local_8 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                               in_stack_ffffffffffffff5c);
        local_10 = pnVar3;
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                  ((cpp_dec_float<100U,_int,_void> *)
                   CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                   (cpp_dec_float<100U,_int,_void> *)
                   CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
      }
      else {
        pnVar3 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                              in_stack_ffffffffffffff5c);
        local_18 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                                in_stack_ffffffffffffff5c);
        local_20 = pnVar3;
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                  ((cpp_dec_float<100U,_int,_void> *)
                   CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                   (cpp_dec_float<100U,_int,_void> *)
                   CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
      }
    }
    pSVar2 = SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ::Desc::rowStatus((Desc *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60)
                               ,in_stack_ffffffffffffff5c);
    *pSVar2 = local_58;
  }
  else {
    pSVar2 = SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ::Desc::colStatus((Desc *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60)
                               ,in_stack_ffffffffffffff5c);
    SPxOut::
    debug<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_const_char_(&)[44],_int_&,_soplex::SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Desc::Status_&,_soplex::SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Desc::Status_&,_0>
              (in_RDI,(char (*) [44])"DLEAVE59 rejectLeave()  : col {}: {} -> {}\n",local_54,pSVar2,
               &local_58);
    if (local_58 == D_ON_BOTH) {
      pSVar2 = SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ::Desc::colStatus((Desc *)CONCAT44(in_stack_ffffffffffffff64,
                                                  in_stack_ffffffffffffff60),
                                 in_stack_ffffffffffffff5c);
      if (*pSVar2 == P_ON_UPPER) {
        pnVar3 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                              in_stack_ffffffffffffff5c);
        local_28 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                                in_stack_ffffffffffffff5c);
        local_30 = pnVar3;
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                  ((cpp_dec_float<100U,_int,_void> *)
                   CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                   (cpp_dec_float<100U,_int,_void> *)
                   CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
      }
      else {
        pnVar3 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                              in_stack_ffffffffffffff5c);
        local_38 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                                in_stack_ffffffffffffff5c);
        local_40 = pnVar3;
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                  ((cpp_dec_float<100U,_int,_void> *)
                   CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                   (cpp_dec_float<100U,_int,_void> *)
                   CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
      }
    }
    pSVar2 = SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ::Desc::colStatus((Desc *)CONCAT44(local_58,in_stack_ffffffffffffff60),
                               in_stack_ffffffffffffff5c);
    *pSVar2 = local_58;
  }
  return;
}

Assistant:

void SPxSolverBase<R>::rejectLeave(
   int leaveNum,
   SPxId leaveId,
   typename SPxBasisBase<R>::Desc::Status leaveStat,
   const SVectorBase<R>* //newVec
)
{
   typename SPxBasisBase<R>::Desc& ds = this->desc();

   if(leaveId.isSPxRowId())
   {
      SPxOut::debug(this, "DLEAVE58 rejectLeave()  : row {}: {} -> {}\n", leaveNum,
                    ds.rowStatus(leaveNum), leaveStat);

      if(leaveStat == SPxBasisBase<R>::Desc::D_ON_BOTH)
      {
         if(ds.rowStatus(leaveNum) == SPxBasisBase<R>::Desc::P_ON_LOWER)
            theLRbound[leaveNum] = theURbound[leaveNum];
         else
            theURbound[leaveNum] = theLRbound[leaveNum];
      }

      ds.rowStatus(leaveNum) = leaveStat;
   }
   else
   {
      SPxOut::debug(this, "DLEAVE59 rejectLeave()  : col {}: {} -> {}\n", leaveNum,
                    ds.colStatus(leaveNum), leaveStat);

      if(leaveStat == SPxBasisBase<R>::Desc::D_ON_BOTH)
      {
         if(ds.colStatus(leaveNum) == SPxBasisBase<R>::Desc::P_ON_UPPER)
            theLCbound[leaveNum] = theUCbound[leaveNum];
         else
            theUCbound[leaveNum] = theLCbound[leaveNum];
      }

      ds.colStatus(leaveNum) = leaveStat;
   }
}